

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O2

void __thiscall icu_63::double_conversion::Bignum::Align(Bignum *this,Bignum *other)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar1 = this->exponent_;
  iVar2 = other->exponent_;
  if (iVar2 < iVar1) {
    uVar4 = iVar1 - iVar2;
    lVar5 = (long)this->used_digits_;
    if (0x80 < (int)(this->used_digits_ + uVar4)) {
      abort();
    }
    puVar3 = (this->bigits_).start_;
    for (; 0 < lVar5; lVar5 = lVar5 + -1) {
      puVar3[((long)iVar1 + lVar5 + -1) - (long)iVar2] = puVar3[lVar5 + -1];
    }
    puVar3 = (this->bigits_).start_;
    uVar6 = 0;
    uVar7 = 0;
    if (0 < (int)uVar4) {
      uVar7 = (ulong)uVar4;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      puVar3[uVar6] = 0;
    }
    this->used_digits_ = this->used_digits_ + uVar4;
    this->exponent_ = this->exponent_ - uVar4;
  }
  return;
}

Assistant:

void Bignum::Align(const Bignum& other) {
  if (exponent_ > other.exponent_) {
    // If "X" represents a "hidden" digit (by the exponent) then we are in the
    // following case (a == this, b == other):
    // a:  aaaaaaXXXX   or a:   aaaaaXXX
    // b:     bbbbbbX      b: bbbbbbbbXX
    // We replace some of the hidden digits (X) of a with 0 digits.
    // a:  aaaaaa000X   or a:   aaaaa0XX
    int zero_digits = exponent_ - other.exponent_;
    EnsureCapacity(used_digits_ + zero_digits);
    for (int i = used_digits_ - 1; i >= 0; --i) {
      bigits_[i + zero_digits] = bigits_[i];
    }
    for (int i = 0; i < zero_digits; ++i) {
      bigits_[i] = 0;
    }
    used_digits_ += zero_digits;
    exponent_ -= zero_digits;
    ASSERT(used_digits_ >= 0);
    ASSERT(exponent_ >= 0);
  }
}